

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visualizer.cpp
# Opt level: O1

int __thiscall iDynTree::Visualizer::init(Visualizer *this,EVP_PKEY_CTX *ctx)

{
  iDynTree::reportError
            ("Visualizer","init",
             "Impossible to use iDynTree::Visualizer, as iDynTree has been compiled without Irrlicht."
            );
  return 0;
}

Assistant:

bool Visualizer::init(const VisualizerOptions &visualizerOptions)
{
#ifdef IDYNTREE_USES_IRRLICHT
    if( pimpl->m_isInitialized )
    {
        reportWarning("Visualizer","init","Visualier already initialized, call close() to close it to open it again.");
        return false;
    }

    // initialize the color palette
    pimpl->initializePalette();

    irr::SIrrlichtCreationParameters irrDevParams;

#ifdef IDYNTREE_USE_GLFW_WINDOW
    if (pimpl->m_glfwInstances == 0)
    {
        if (!glfwInit()) {
            reportError("Visualizer", "init", "Unable to initialize GLFW");
            return false;
        }

        glfwWindowHint(GLFW_SAMPLES, 4); //Antialiasing
    }
    pimpl->m_glfwInstances++;

    pimpl->m_window = glfwCreateWindow(visualizerOptions.winWidth, visualizerOptions.winHeight, "iDynTree Visualizer", nullptr, nullptr);
    if (!pimpl->m_window) {
        reportError("Visualizer","init","Could not create window");
        return false;
    }

    glfwMakeContextCurrent(pimpl->m_window);
    glfwSwapInterval(1);

#if defined(_WIN32)
    pimpl->m_windowId = glfwGetWin32Window(pimpl->m_window);
    irrDevParams.WindowId = (void*)(pimpl->m_windowId);
#elif defined(__APPLE__)
    pimpl->m_windowId = glfwGetCocoaWindow(pimpl->m_window);
    irrDevParams.WindowId = (void*)(pimpl->m_windowId);
#elif defined(__linux__)

    void* nativeWindow = nullptr;

    #ifdef IDYNTREE_GLFW_TRY_WAYLAND_FIRST
        // Try Wayland first
        struct wl_surface* waylandWindow = glfwGetWaylandWindow(pimpl->m_window);
    #else
        void* waylandWindow = nullptr;
    #endif

    if (waylandWindow)
    {
        nativeWindow = static_cast<void*>(waylandWindow);
    }
    else
    {
        // Fallback to X11
        Window x11Window = glfwGetX11Window(pimpl->m_window);
        if (x11Window)
            nativeWindow = static_cast<void*>(reinterpret_cast<void*>(x11Window));
    }
    irrDevParams.WindowId = nativeWindow;
#endif

    irrDevParams.DeviceType = irr::EIDT_SDL;
#endif

    irrDevParams.DriverType = irr::video::EDT_OPENGL;
    irrDevParams.WindowSize = irr::core::dimension2d<irr::u32>(visualizerOptions.winWidth, visualizerOptions.winHeight);
    irrDevParams.WithAlphaChannel = true;
    irrDevParams.AntiAlias = 4;

    if( visualizerOptions.verbose )
    {
        reportWarning("Visualizer","init","verbose flag found, enabling verbose output in Visualizer");
        irrDevParams.LoggingLevel = irr::ELL_DEBUG;
    }

    pimpl->m_irrDevice = 0;

// The Irrlicht SDL device overwrites the value of the SDL_VIDEODRIVER
// environment variable, and this prevents the driver to work correctly.
// For this reason, we save the value before the irr::createDeviceEx call,
// and we restore it (or we unset it) after call
// Workaround for https://github.com/robotology/idyntree/issues/986
#if defined(_WIN32) && defined(_IRR_COMPILE_WITH_SDL_DEVICE_)
    const char * SDL_VIDEODRIVER_value = NULL;
    if (irrDevParams.DeviceType == irr::EIDT_SDL) {
        SDL_VIDEODRIVER_value = std::getenv("SDL_VIDEODRIVER");
    }
#endif

    pimpl->m_irrDevice = irr::createDeviceEx(irrDevParams);

#if defined(_WIN32) && defined(_IRR_COMPILE_WITH_SDL_DEVICE_)
    if (irrDevParams.DeviceType == irr::EIDT_SDL) {
        SetEnvironmentVariableA("SDL_VIDEODRIVER", SDL_VIDEODRIVER_value);
    }
#endif

    if (pimpl->m_irrDevice == 0)
    {
        reportError("Visualizer","init","Impossible to load irrlicht device");
        return false; // could not create selected driver.
    }

    // Checking the irrDevice
    if (pimpl->m_irrDevice == (void*)1)
    {
        reportError("Visualizer","init","Impossible to load irrlicht device, createDevice returned a 1 pointer");
        pimpl->m_irrDevice = 0;
        return false; // could not create selected driver.
    }

    pimpl->m_irrSmgr = pimpl->m_irrDevice->getSceneManager();

    // Get video driver
    pimpl->m_irrDriver = pimpl->m_irrDevice->getVideoDriver();

    pimpl->m_irrVideoData = pimpl->m_irrDriver->getExposedVideoData(); //save the current window settings.
                                                                       //This is helpful in case other Viualizer objects are created
                                                                       // since Irrlicht by default draws on the last window opened.

    // Always visualize the mouse cursor
    pimpl->m_irrDevice->getCursorControl()->setVisible(true);

    // Add environment
    pimpl->rootFrameArrowsDimension = visualizerOptions.rootFrameArrowsDimension;
    pimpl->m_environment.init(pimpl->m_irrSmgr, pimpl->rootFrameArrowsDimension);

    pimpl->m_camera.setIrrlichtCamera(addVizCamera(pimpl->m_irrSmgr));
    pimpl->m_camera.setCameraAnimator(new CameraAnimator(addFrameAxes(pimpl->m_irrSmgr, 0, 0.1), visualizerOptions.winWidth, visualizerOptions.winHeight));

    pimpl->m_vectors.init(pimpl->m_irrSmgr);

    pimpl->m_frames.init(pimpl->m_irrSmgr, pimpl->m_modelViz);

    pimpl->m_shapes.init(pimpl->m_irrSmgr, pimpl->m_modelViz);

    pimpl->m_textures.init(pimpl->m_irrDriver, pimpl->m_irrSmgr);

#ifdef IDYNTREE_USE_GLFW_WINDOW
    glfwSetWindowUserPointer(pimpl->m_window, pimpl);
    glfwSetCursorPosCallback(pimpl->m_window, VisualizerPimpl::cursor_position_callback);
    glfwSetMouseButtonCallback(pimpl->m_window, VisualizerPimpl::mouse_button_callback);
    glfwSetScrollCallback(pimpl->m_window, VisualizerPimpl::scroll_callback);
#endif

    pimpl->m_isInitialized = true;
    pimpl->lastFPS         = -1;

    return true;
#else
    IDYNTREE_UNUSED(visualizerOptions);
    reportError("Visualizer","init","Impossible to use iDynTree::Visualizer, as iDynTree has been compiled without Irrlicht.");
    return false;
#endif
}